

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::OneHotLayerParams::OneHotLayerParams
          (OneHotLayerParams *this,OneHotLayerParams *from)

{
  void *pvVar1;
  int64 iVar2;
  float fVar3;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__OneHotLayerParams_0076cb38;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  fVar3 = from->offvalue_;
  this->onvalue_ = from->onvalue_;
  this->offvalue_ = fVar3;
  iVar2 = from->axis_;
  this->onehotvectorsize_ = from->onehotvectorsize_;
  this->axis_ = iVar2;
  return;
}

Assistant:

OneHotLayerParams::OneHotLayerParams(const OneHotLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&onehotvectorsize_, &from.onehotvectorsize_,
    reinterpret_cast<char*>(&offvalue_) -
    reinterpret_cast<char*>(&onehotvectorsize_) + sizeof(offvalue_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.OneHotLayerParams)
}